

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

int STRING_sprintf(STRING_HANDLE handle,char *format,...)

{
  char in_AL;
  uint uVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  size_t sVar4;
  int iVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar6;
  long lVar7;
  size_t __size;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg_list;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (handle == (STRING_HANDLE)0x0 || format == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x241;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x241;
    }
    pcVar6 = "Invalid arg (NULL)";
    iVar5 = 0x240;
  }
  else {
    local_f8 = local_e8;
    local_100 = &stack0x00000008;
    local_108 = 0x3000000010;
    uVar1 = vsnprintf((char *)0x0,0,format,&local_108);
    if ((int)uVar1 < 0) {
      p_Var3 = xlogging_get_log_function();
      iVar2 = 0x24f;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return 0x24f;
      }
      pcVar6 = "Failure vsnprintf return < 0";
      iVar5 = 0x24e;
    }
    else {
      if (uVar1 == 0) {
        return 0;
      }
      pcVar6 = handle->s;
      sVar4 = strlen(pcVar6);
      lVar7 = uVar1 + sVar4;
      if (CARRY8((ulong)uVar1,sVar4)) {
        lVar7 = -1;
      }
      __size = lVar7 + 1;
      if (__size == 0) {
        __size = 0xffffffffffffffff;
      }
      if ((__size != 0xffffffffffffffff) &&
         (pcVar6 = (char *)realloc(pcVar6,__size), pcVar6 != (char *)0x0)) {
        handle->s = pcVar6;
        local_f8 = local_e8;
        local_100 = &stack0x00000008;
        local_108 = 0x3000000010;
        iVar2 = vsnprintf(handle->s + sVar4,__size,format,&local_108);
        if (-1 < iVar2) {
          return 0;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/strings.c"
                    ,"STRING_sprintf",0x264,1,"Failure vsnprintf formatting error");
        }
        handle->s[sVar4] = '\0';
        return 0x266;
      }
      p_Var3 = xlogging_get_log_function();
      iVar2 = 0x273;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return 0x273;
      }
      pcVar6 = "Failure unable to reallocate memory. size=%zu";
      iVar5 = 0x272;
    }
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/strings.c"
            ,"STRING_sprintf",iVar5,1,pcVar6);
  return iVar2;
}

Assistant:

__attribute__((format(printf, 2, 3)))
#endif
int STRING_sprintf(STRING_HANDLE handle, const char* format, ...)
{
    int result;

#ifdef STRINGS_C_SPRINTF_BUFFER_SIZE
    size_t maxBufSize = STRINGS_C_SPRINTF_BUFFER_SIZE;
    char buf[STRINGS_C_SPRINTF_BUFFER_SIZE];
#else
    size_t maxBufSize = 0;
    char* buf = NULL;
#endif

    if (handle == NULL || format == NULL)
    {
        /* Codes_SRS_STRING_07_042: [if the parameters s1 or format are NULL then STRING_sprintf shall return non zero value.] */
        LogError("Invalid arg (NULL)");
        result = MU_FAILURE;
    }
    else
    {
        va_list arg_list;
        int s2Length;
        va_start(arg_list, format);

        s2Length = vsnprintf(buf, maxBufSize, format, arg_list);
        va_end(arg_list);
        if (s2Length < 0)
        {
            /* Codes_SRS_STRING_07_043: [If any error is encountered STRING_sprintf shall return a non zero value.] */
            LogError("Failure vsnprintf return < 0");
            result = MU_FAILURE;
        }
        else if (s2Length == 0)
        {
            // Don't need to reallocate and nothing should be added
            result = 0;
        }
        else
        {
            STRING* s1 = (STRING*)handle;
            char* temp;
            size_t s1Length = strlen(s1->s);
            size_t realloc_size = safe_add_size_t(safe_add_size_t(s1Length, s2Length), 1);
            if (realloc_size != SIZE_MAX &&
                (temp = (char*)realloc(s1->s, realloc_size)) != NULL)
            {
                s1->s = temp;
                va_start(arg_list, format);
                if (vsnprintf(s1->s + s1Length, realloc_size, format, arg_list) < 0)
                {
                    /* Codes_SRS_STRING_07_043: [If any error is encountered STRING_sprintf shall return a non zero value.] */
                    LogError("Failure vsnprintf formatting error");
                    s1->s[s1Length] = '\0';
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_STRING_07_044: [On success STRING_sprintf shall return 0.]*/
                    result = 0;
                }
                va_end(arg_list);
            }
            else
            {
                /* Codes_SRS_STRING_07_043: [If any error is encountered STRING_sprintf shall return a non zero value.] */
                LogError("Failure unable to reallocate memory. size=%zu", realloc_size);
                result = MU_FAILURE;
            }
        }
    }
    return result;
}